

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O1

void Handler_translation_L_Actor(AActor *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  uint uVar1;
  char *text;
  DWORD DVar2;
  long lVar3;
  FRemapTable CurrentTranslation;
  FName local_5c;
  AActor *local_58;
  FRemapTable local_50;
  
  if (params[1].i == 0) {
    uVar1 = params[2].i;
    if (6 < uVar1) {
      I_Error("Translation must be in the range [0,%d]",6);
    }
    defaults->Translation = uVar1 | 0x30000;
  }
  else {
    local_58 = defaults;
    FRemapTable::FRemapTable(&local_50,0x100);
    FRemapTable::MakeIdentity(&local_50);
    for (lVar3 = 1; lVar3 < params->i; lVar3 = lVar3 + 1) {
      text = params[lVar3 + 1].s;
      if (params->i == 2 && lVar3 == 1) {
        local_5c.Index = FName::NameManager::FindName(&FName::NameData,text,false);
        DVar2 = R_FindCustomTranslation(&local_5c);
        if (DVar2 != 0xffffffff) goto LAB_0051e88d;
      }
      FRemapTable::AddToTranslation(&local_50,text);
    }
    DVar2 = FRemapTable::StoreTranslation(&local_50,7);
LAB_0051e88d:
    local_58->Translation = DVar2;
    FRemapTable::~FRemapTable(&local_50);
  }
  return;
}

Assistant:

DEFINE_PROPERTY(translation, L, Actor)
{
	PROP_INT_PARM(type, 0);

	if (type == 0)
	{
		PROP_INT_PARM(trans, 1);
		int max = 6;// (gameinfo.gametype == GAME_Strife || (info->GameFilter&GAME_Strife)) ? 6 : 2;
		if (trans < 0 || trans > max)
		{
			I_Error ("Translation must be in the range [0,%d]", max);
		}
		defaults->Translation = TRANSLATION(TRANSLATION_Standard, trans);
	}
	else 
	{
		FRemapTable CurrentTranslation;

		CurrentTranslation.MakeIdentity();
		for(int i = 1; i < PROP_PARM_COUNT; i++)
		{
			PROP_STRING_PARM(str, i);
			int tnum;
			if (i== 1 && PROP_PARM_COUNT == 2 && (tnum = R_FindCustomTranslation(str)) != -1)
			{
				defaults->Translation = tnum;
				return;
			}
			else
			{
				CurrentTranslation.AddToTranslation(str);
			}
		}
		defaults->Translation = CurrentTranslation.StoreTranslation (TRANSLATION_Decorate);
	}
}